

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory_unix.cpp
# Opt level: O2

bool __thiscall xmrig::VirtualMemory::allocateLargePagesMemory(VirtualMemory *this)

{
  int iVar1;
  uint8_t *puVar2;
  
  puVar2 = (uint8_t *)allocateLargePagesMemory(this->m_size);
  this->m_scratchpad = puVar2;
  if (puVar2 != (uint8_t *)0x0) {
    std::bitset<3UL>::set(&this->m_flags,0,true);
    madvise(this->m_scratchpad,this->m_size,3);
    iVar1 = mlock(this->m_scratchpad,this->m_size);
    if (iVar1 == 0) {
      std::bitset<3UL>::set(&this->m_flags,1,true);
    }
  }
  return puVar2 != (uint8_t *)0x0;
}

Assistant:

bool xmrig::VirtualMemory::allocateLargePagesMemory()
{
    m_scratchpad = static_cast<uint8_t*>(allocateLargePagesMemory(m_size));
    if (m_scratchpad) {
        m_flags.set(FLAG_HUGEPAGES, true);

        madvise(m_scratchpad, m_size, MADV_RANDOM | MADV_WILLNEED);

        if (mlock(m_scratchpad, m_size) == 0) {
            m_flags.set(FLAG_LOCK, true);
        }

        return true;
    }

    return false;
}